

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool __thiscall xatlas::internal::segment::Atlas::isNormalSeam(Atlas *this,uint32_t edge)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t vertex;
  uint32_t vertex_00;
  uint32_t vertex_01;
  uint *puVar4;
  Vector3 *pVVar5;
  Vector3 *pVVar6;
  int iVar7;
  
  uVar3 = Mesh::oppositeEdge(this->m_mesh,edge);
  if (uVar3 == 0xffffffff) {
    return false;
  }
  if ((this->m_mesh->m_flags & 4) == 0) {
    puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,edge / 3);
    uVar1 = *puVar4;
    puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,uVar3 / 3);
    if (uVar1 == *puVar4) {
      return false;
    }
    pVVar5 = Array<xatlas::internal::Vector3>::operator[](&this->m_faceNormals,edge / 3);
    pVVar6 = Array<xatlas::internal::Vector3>::operator[](&this->m_faceNormals,uVar3 / 3);
  }
  else {
    vertex = Mesh::vertexAt(this->m_mesh,edge);
    iVar7 = edge % 3 + 1;
    if (iVar7 == 3) {
      iVar7 = 0;
    }
    vertex_00 = Mesh::vertexAt(this->m_mesh,iVar7 + (edge - edge % 3));
    vertex_01 = Mesh::vertexAt(this->m_mesh,uVar3);
    iVar7 = uVar3 % 3 + 1;
    if (iVar7 == 3) {
      iVar7 = 0;
    }
    uVar3 = Mesh::vertexAt(this->m_mesh,iVar7 + (uVar3 - uVar3 % 3));
    if ((vertex_00 == vertex_01) && (vertex == uVar3)) {
      return false;
    }
    pVVar5 = Mesh::normal(this->m_mesh,vertex);
    pVVar6 = Mesh::normal(this->m_mesh,uVar3);
    bVar2 = equal(pVVar5,pVVar6,0.001);
    if (!bVar2) {
      return true;
    }
    pVVar5 = Mesh::normal(this->m_mesh,vertex_00);
    pVVar6 = Mesh::normal(this->m_mesh,vertex_01);
  }
  bVar2 = equal(pVVar5,pVVar6,0.001);
  return !bVar2;
}

Assistant:

bool isNormalSeam(uint32_t edge) const
	{
		const uint32_t oppositeEdge = m_mesh->oppositeEdge(edge);
		if (oppositeEdge == UINT32_MAX)
			return false; // boundary edge
		if (m_mesh->flags() & MeshFlags::HasNormals) {
			const uint32_t v0 = m_mesh->vertexAt(meshEdgeIndex0(edge));
			const uint32_t v1 = m_mesh->vertexAt(meshEdgeIndex1(edge));
			const uint32_t ov0 = m_mesh->vertexAt(meshEdgeIndex0(oppositeEdge));
			const uint32_t ov1 = m_mesh->vertexAt(meshEdgeIndex1(oppositeEdge));
			if (v0 == ov1 && v1 == ov0)
				return false;
			return !equal(m_mesh->normal(v0), m_mesh->normal(ov1), kNormalEpsilon) || !equal(m_mesh->normal(v1), m_mesh->normal(ov0), kNormalEpsilon);
		}
		const uint32_t f0 = meshEdgeFace(edge);
		const uint32_t f1 = meshEdgeFace(oppositeEdge);
		if (m_facePlanarRegionId[f0] == m_facePlanarRegionId[f1])
			return false;
		return !equal(m_faceNormals[f0], m_faceNormals[f1], kNormalEpsilon);
	}